

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckVariablePerLine.cxx
# Opt level: O0

bool __thiscall kws::Parser::CheckVariablePerLine(Parser *this,unsigned_long max)

{
  undefined8 uVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  ulong in_RSI;
  long in_RDI;
  bool bVar5;
  Error error;
  char localval [22];
  long eof;
  bool endofline;
  long posClosing;
  long openCurly;
  bool betweenBraces;
  uint vars;
  string line_temp;
  int poscomend;
  int poscom;
  string line;
  long pos;
  bool firstWord;
  size_t posType;
  string typeToFind;
  char **type;
  char **__end1;
  char **__begin1;
  char *(*__range1) [12];
  bool hasError;
  char *types [12];
  char *val;
  size_t length;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb00;
  value_type *in_stack_fffffffffffffb08;
  vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *in_stack_fffffffffffffb10;
  char *in_stack_fffffffffffffb18;
  char *in_stack_fffffffffffffb20;
  Parser *in_stack_fffffffffffffb28;
  string *in_stack_fffffffffffffb48;
  undefined6 in_stack_fffffffffffffb50;
  byte in_stack_fffffffffffffb56;
  undefined1 in_stack_fffffffffffffb57;
  Parser *in_stack_fffffffffffffb58;
  allocator *in_stack_fffffffffffffb60;
  undefined7 in_stack_fffffffffffffb68;
  undefined1 in_stack_fffffffffffffb6f;
  byte local_462;
  Parser *in_stack_fffffffffffffbb8;
  allocator *in_stack_fffffffffffffbc0;
  undefined7 in_stack_fffffffffffffbc8;
  undefined1 in_stack_fffffffffffffbcf;
  Parser *in_stack_fffffffffffffbd0;
  Parser *in_stack_fffffffffffffbd8;
  char in_stack_fffffffffffffbe6;
  char in_stack_fffffffffffffbe7;
  Parser *in_stack_fffffffffffffbe8;
  byte local_402;
  string local_388 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  byte local_341;
  string local_340 [32];
  size_t local_320;
  Parser *local_318;
  byte local_30c;
  byte local_30b;
  byte local_30a;
  allocator local_309;
  string local_308 [37];
  byte local_2e3;
  byte local_2e2;
  allocator local_2e1;
  string local_2e0 [37];
  byte local_2bb;
  byte local_2ba;
  allocator local_2b9;
  string local_2b8 [39];
  allocator local_291;
  string local_290 [32];
  uint local_270;
  byte local_26b;
  byte local_26a;
  allocator local_269;
  string local_268 [37];
  byte local_243;
  byte local_242;
  undefined1 local_241 [38];
  byte local_21b;
  byte local_21a;
  allocator local_219;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [36];
  int local_14c;
  string local_148 [36];
  int local_124;
  string local_120 [32];
  Parser *local_100;
  undefined1 local_f1;
  Parser *local_f0;
  allocator local_d1;
  string local_d0 [32];
  undefined8 *local_b0;
  undefined8 *local_a8;
  undefined8 *local_a0;
  undefined8 local_98;
  _Alloc_hider local_89;
  undefined8 local_88 [12];
  undefined8 uStack_28;
  char *local_20;
  undefined8 local_18;
  ulong local_10;
  
  *(undefined1 *)(in_RDI + 0x4a) = 1;
  local_18 = 0xff;
  local_10 = in_RSI;
  local_20 = (char *)operator_new__(0xff);
  snprintf(local_20,0xff,"Variables per line = %ld max",local_10);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x398),local_20);
  local_462 = in_stack_fffffffffffffb56;
  if (local_20 != (char *)0x0) {
    operator_delete__(local_20);
    local_462 = in_stack_fffffffffffffb56;
  }
  memcpy(local_88,&DAT_0021dd40,0x60);
  local_89 = (_Alloc_hider)0x0;
  local_a0 = local_88;
  local_a8 = &uStack_28;
  local_98 = local_a0;
  do {
    if (local_a0 == local_a8) {
      return (bool)(((byte)local_89 ^ 0xff) & 1);
    }
    local_b0 = local_a0;
    pcVar3 = (char *)*local_a0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,pcVar3,&local_d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    std::__cxx11::string::operator+=(local_d0," ");
    local_f0 = (Parser *)std::__cxx11::string::find((string *)(in_RDI + 0x518),(ulong)local_d0);
    while (local_f0 != (Parser *)0xffffffffffffffff) {
      local_f1 = 0;
      local_100 = local_f0;
      do {
        local_100 = (Parser *)
                    ((long)&local_100[-1].m_IfElseEndifList.
                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
        bVar5 = false;
        if (0 < (long)local_100) {
          pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
          bVar5 = *pcVar3 == ' ';
        }
      } while (bVar5);
      if (((long)local_100 < 1) ||
         (pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518), *pcVar3 == '\n')) {
        local_f1 = 1;
      }
      if ((local_f1 & 1) != 0) {
        GetLineNumber(in_stack_fffffffffffffb28,(size_t)in_stack_fffffffffffffb20,
                      SUB81((ulong)in_stack_fffffffffffffb18 >> 0x38,0));
        GetLine_abi_cxx11_(in_stack_fffffffffffffb58,
                           CONCAT17(in_stack_fffffffffffffb57,
                                    CONCAT16(local_462,in_stack_fffffffffffffb50)));
        local_124 = std::__cxx11::string::find((char *)local_120,0x1d8c52);
        if (local_124 != -1) {
          std::__cxx11::string::substr((ulong)local_148,(ulong)local_120);
          std::__cxx11::string::operator=(local_120,local_148);
          std::__cxx11::string::~string(local_148);
        }
        local_124 = std::__cxx11::string::find((char *)local_120,0x1d8c55);
        while (local_124 != -1) {
          local_14c = std::__cxx11::string::find((char *)local_120,0x1d8c58);
          if (local_14c == -1) {
            std::__cxx11::string::substr((ulong)local_170,(ulong)local_120);
            std::__cxx11::string::operator=(local_120,local_170);
            std::__cxx11::string::~string(local_170);
            break;
          }
          std::__cxx11::string::substr((ulong)local_190,(ulong)local_120);
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_1d0,(ulong)local_120);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
          std::__cxx11::string::operator=(local_120,local_1b0);
          std::__cxx11::string::~string(local_1b0);
          std::__cxx11::string::~string(local_1d0);
          local_124 = std::__cxx11::string::find((char *)local_120,0x1d8c55);
          std::__cxx11::string::~string(local_190);
        }
        std::allocator<char>::allocator();
        local_21a = 0;
        local_21b = 0;
        local_242 = 0;
        local_243 = 0;
        local_26a = 0;
        local_26b = 0;
        std::__cxx11::string::string(local_1f0,"",&local_1f1);
        bVar5 = IsBetweenChars(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe7,
                               in_stack_fffffffffffffbe6,(size_t)in_stack_fffffffffffffbd8,
                               SUB81((ulong)in_stack_fffffffffffffbd0 >> 0x38,0),
                               (string *)
                               CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
        local_402 = 0;
        if (!bVar5) {
          in_stack_fffffffffffffbe8 = local_f0;
          std::allocator<char>::allocator();
          local_21a = 1;
          std::__cxx11::string::string(local_218,"",&local_219);
          local_21b = 1;
          in_stack_fffffffffffffbe7 =
               IsBetweenCharsFast((Parser *)
                                  CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68),
                                  (char)((ulong)in_stack_fffffffffffffb60 >> 0x38),
                                  (char)((ulong)in_stack_fffffffffffffb60 >> 0x30),
                                  (size_t)in_stack_fffffffffffffb58,(bool)in_stack_fffffffffffffb57,
                                  in_stack_fffffffffffffb48);
          local_402 = 0;
          if (!(bool)in_stack_fffffffffffffbe7) {
            in_stack_fffffffffffffbd8 = (Parser *)local_241;
            in_stack_fffffffffffffbd0 = local_f0;
            std::allocator<char>::allocator();
            local_242 = 1;
            std::__cxx11::string::string
                      ((string *)(local_241 + 1),"",(allocator *)in_stack_fffffffffffffbd8);
            local_243 = 1;
            in_stack_fffffffffffffbcf =
                 IsBetweenChars(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe7,
                                in_stack_fffffffffffffbe6,(size_t)in_stack_fffffffffffffbd8,
                                SUB81((ulong)in_stack_fffffffffffffbd0 >> 0x38,0),
                                (string *)
                                CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
            local_402 = 0;
            if (!(bool)in_stack_fffffffffffffbcf) {
              in_stack_fffffffffffffbc0 = &local_269;
              in_stack_fffffffffffffbb8 = local_f0;
              std::allocator<char>::allocator();
              local_26a = 1;
              std::__cxx11::string::string(local_268,"",in_stack_fffffffffffffbc0);
              local_26b = 1;
              bVar5 = IsBetweenCharsFast((Parser *)
                                         CONCAT17(in_stack_fffffffffffffb6f,
                                                  in_stack_fffffffffffffb68),
                                         (char)((ulong)in_stack_fffffffffffffb60 >> 0x38),
                                         (char)((ulong)in_stack_fffffffffffffb60 >> 0x30),
                                         (size_t)in_stack_fffffffffffffb58,
                                         (bool)in_stack_fffffffffffffb57,in_stack_fffffffffffffb48);
              local_402 = bVar5 ^ 0xff;
            }
          }
        }
        if ((local_26b & 1) != 0) {
          std::__cxx11::string::~string(local_268);
        }
        if ((local_26a & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_269);
        }
        if ((local_243 & 1) != 0) {
          std::__cxx11::string::~string((string *)(local_241 + 1));
        }
        if ((local_242 & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)local_241);
        }
        if ((local_21b & 1) != 0) {
          std::__cxx11::string::~string(local_218);
        }
        if ((local_21a & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_219);
        }
        std::__cxx11::string::~string(local_1f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
        if ((local_402 & 1) != 0) {
          local_270 = 1;
          local_100 = (Parser *)std::__cxx11::string::find((char)local_120,0x2c);
          while (local_100 != (Parser *)0xffffffffffffffff) {
            local_f0 = (Parser *)std::__cxx11::string::find((char)in_RDI + '\x18',0x2c);
            std::allocator<char>::allocator();
            local_2ba = 0;
            local_2bb = 0;
            local_2e2 = 0;
            local_2e3 = 0;
            local_30a = 0;
            local_30b = 0;
            std::__cxx11::string::string(local_290,"",&local_291);
            bVar5 = IsBetweenChars(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe7,
                                   in_stack_fffffffffffffbe6,(size_t)in_stack_fffffffffffffbd8,
                                   SUB81((ulong)in_stack_fffffffffffffbd0 >> 0x38,0),
                                   (string *)
                                   CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
            local_462 = 0;
            if (!bVar5) {
              std::allocator<char>::allocator();
              local_2ba = 1;
              std::__cxx11::string::string(local_2b8,"",&local_2b9);
              local_2bb = 1;
              bVar5 = IsBetweenCharsFast((Parser *)
                                         CONCAT17(in_stack_fffffffffffffb6f,
                                                  in_stack_fffffffffffffb68),
                                         (char)((ulong)in_stack_fffffffffffffb60 >> 0x38),
                                         (char)((ulong)in_stack_fffffffffffffb60 >> 0x30),
                                         (size_t)in_stack_fffffffffffffb58,
                                         (bool)in_stack_fffffffffffffb57,in_stack_fffffffffffffb48);
              local_462 = 0;
              if (!bVar5) {
                std::allocator<char>::allocator();
                local_2e2 = 1;
                std::__cxx11::string::string(local_2e0,"",&local_2e1);
                local_2e3 = 1;
                in_stack_fffffffffffffb6f =
                     IsBetweenChars(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe7,
                                    in_stack_fffffffffffffbe6,(size_t)in_stack_fffffffffffffbd8,
                                    SUB81((ulong)in_stack_fffffffffffffbd0 >> 0x38,0),
                                    (string *)
                                    CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
                local_462 = 0;
                if (!(bool)in_stack_fffffffffffffb6f) {
                  in_stack_fffffffffffffb60 = &local_309;
                  in_stack_fffffffffffffb58 = local_f0;
                  std::allocator<char>::allocator();
                  local_30a = 1;
                  std::__cxx11::string::string(local_308,"",in_stack_fffffffffffffb60);
                  local_30b = 1;
                  in_stack_fffffffffffffb57 =
                       IsBetweenCharsFast((Parser *)
                                          CONCAT17(in_stack_fffffffffffffb6f,
                                                   in_stack_fffffffffffffb68),
                                          (char)((ulong)in_stack_fffffffffffffb60 >> 0x38),
                                          (char)((ulong)in_stack_fffffffffffffb60 >> 0x30),
                                          (size_t)in_stack_fffffffffffffb58,
                                          (bool)in_stack_fffffffffffffb57,in_stack_fffffffffffffb48)
                  ;
                  local_462 = in_stack_fffffffffffffb57 ^ 0xff;
                }
              }
            }
            if ((local_30b & 1) != 0) {
              std::__cxx11::string::~string(local_308);
            }
            if ((local_30a & 1) != 0) {
              std::allocator<char>::~allocator((allocator<char> *)&local_309);
            }
            if ((local_2e3 & 1) != 0) {
              std::__cxx11::string::~string(local_2e0);
            }
            if ((local_2e2 & 1) != 0) {
              std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
            }
            if ((local_2bb & 1) != 0) {
              std::__cxx11::string::~string(local_2b8);
            }
            if ((local_2ba & 1) != 0) {
              std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
            }
            std::__cxx11::string::~string(local_290);
            std::allocator<char>::~allocator((allocator<char> *)&local_291);
            if ((local_462 & 1) != 0) {
              local_30c = 0;
              local_318 = local_100;
              do {
                local_318 = (Parser *)
                            ((long)&local_318[-1].m_IfElseEndifList.
                                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
                if ((long)local_318 < 1) goto LAB_001b61bc;
                in_stack_fffffffffffffb48 =
                     (string *)std::__cxx11::string::operator[]((ulong)local_120);
              } while (in_stack_fffffffffffffb48->_M_dataplus != (_Alloc_hider)0x7b);
              std::__cxx11::string::string(local_340,local_120);
              sVar4 = FindClosingChar(in_stack_fffffffffffffbd8,
                                      (char)((ulong)in_stack_fffffffffffffbd0 >> 0x38),
                                      (char)((ulong)in_stack_fffffffffffffbd0 >> 0x30),
                                      CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8),
                                      SUB81((ulong)in_stack_fffffffffffffbc0 >> 0x38,0),
                                      (string *)in_stack_fffffffffffffbb8);
              std::__cxx11::string::~string(local_340);
              local_320 = sVar4;
              if ((sVar4 == 0xffffffffffffffff) || ((long)local_100 < (long)sVar4)) {
                local_30c = 1;
              }
LAB_001b61bc:
              local_341 = 1;
              local_368.field_2._8_8_ = local_100;
              do {
                local_368.field_2._8_8_ =
                     (long)&(((Parser *)local_368.field_2._8_8_)->m_ErrorList).
                            super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
                            _M_impl.super__Vector_impl_data._M_start + 1;
                uVar1 = local_368.field_2._8_8_;
                iVar2 = std::__cxx11::string::size();
                if ((long)iVar2 <= (long)uVar1) goto LAB_001b62d1;
                in_stack_fffffffffffffb28 =
                     (Parser *)std::__cxx11::string::operator[]((ulong)local_120);
              } while ((((*(char *)&(in_stack_fffffffffffffb28->m_ErrorList).
                                    super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>
                                    ._M_impl.super__Vector_impl_data._M_start == ' ') ||
                        (in_stack_fffffffffffffb20 =
                              (char *)std::__cxx11::string::operator[]((ulong)local_120),
                        *in_stack_fffffffffffffb20 == '\n')) ||
                       (in_stack_fffffffffffffb18 =
                             (char *)std::__cxx11::string::operator[]((ulong)local_120),
                       *in_stack_fffffffffffffb18 == '\r')) ||
                      (in_stack_fffffffffffffb10 =
                            (vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
                            std::__cxx11::string::operator[]((ulong)local_120),
                      *(char *)&(in_stack_fffffffffffffb10->
                                super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>
                                )._M_impl.super__Vector_impl_data._M_start == '\t'));
              local_341 = 0;
LAB_001b62d1:
              if (((local_30c & 1) == 0) && ((local_341 & 1) == 0)) {
                local_270 = local_270 + 1;
              }
            }
            local_100 = (Parser *)std::__cxx11::string::find((char)local_120,0x2c);
          }
          if (local_10 < local_270) {
            local_368._0_8_ = 0;
            local_368._M_string_length._0_6_ = 0;
            local_368._M_string_length._6_2_ = 0;
            local_368.field_2._M_allocated_capacity._0_6_ = 0;
            ErrorStruct::ErrorStruct((ErrorStruct *)0x1b635c);
            in_stack_fffffffffffffb08 =
                 (value_type *)
                 GetLineNumber(in_stack_fffffffffffffb28,(size_t)in_stack_fffffffffffffb20,
                               SUB81((ulong)in_stack_fffffffffffffb18 >> 0x38,0));
            std::__cxx11::string::operator=(local_388,"Number of variable per line exceed: ");
            in_stack_fffffffffffffb00 = &local_368;
            snprintf((char *)in_stack_fffffffffffffb00,0x16,"%d",(ulong)local_270);
            std::__cxx11::string::operator+=(local_388,(char *)in_stack_fffffffffffffb00);
            std::__cxx11::string::operator+=(local_388," (max=");
            local_368._0_8_ = local_368._0_8_ & 0xffffffffffffff00;
            snprintf((char *)&local_368,0x16,"%ld",local_10);
            std::__cxx11::string::operator+=(local_388,(char *)&local_368);
            std::__cxx11::string::operator+=(local_388,")");
            std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                      (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
            local_89 = (_Alloc_hider)0x1;
            ErrorStruct::~ErrorStruct((ErrorStruct *)0x1b6491);
          }
        }
        std::__cxx11::string::~string(local_120);
      }
      local_f0 = (Parser *)std::__cxx11::string::find((string *)(in_RDI + 0x518),(ulong)local_d0);
    }
    std::__cxx11::string::~string(local_d0);
    local_a0 = local_a0 + 1;
  } while( true );
}

Assistant:

bool Parser::CheckVariablePerLine(unsigned long max)
{
  m_TestsDone[VARIABLEPERLINE] = true;
  constexpr size_t length = 255;
  char* val = new char[length];
  snprintf(val,length,"Variables per line = %ld max",max);
  m_TestsDescription[VARIABLEPERLINE] = val;
  delete [] val;

  // For the moment only standard types are defined.
  // We might be able to do more with finding typedefs
  #define ntypes 12
  const char* types[ntypes] = {"int","unsigned int",
   "char","unsigned char",
   "short","unsigned short",
   "long","unsigned long",
   "float","double","void","long int"};

  bool hasError = false;
  for (auto &type : types) {
    std::string typeToFind = type;
    typeToFind += " ";
    size_t posType = m_BufferNoComment.find(typeToFind,0);
    while(posType != std::string::npos)
      {
      // Check that this is the first word
      bool firstWord = false;
      auto pos = static_cast<long int>(posType);
      pos--;
      while((pos>0) && (m_BufferNoComment[pos]==' '))
        {
        pos--;
        }
      if((pos<=0) || (m_BufferNoComment[pos]=='\n'))
        {
        firstWord = true;
        }

      if(firstWord)
        {
        std::string line = this->GetLine(this->GetLineNumber(posType,true)-1);

        // Check if we have any comments
        int poscom = static_cast<int>(line.find("//",0));
        if(poscom != -1)
          {
          line = line.substr(0,poscom);
          }
        poscom = static_cast<int>(line.find("/*",0));
        while(poscom != -1)
          {
          int poscomend = static_cast<int>(line.find("*/",0));
          if(poscomend == -1)
            {
            line = line.substr(0,poscom);
            break;
            }

          std::string line_temp = line.substr(0,poscom);
          line = line_temp+line.substr(poscomend+2,line.size()-poscomend-2);
          poscom = static_cast<int>(line.find("/*",poscom+1));
          }

        // If we have any '(' in the line we stop
        if( !this->IsBetweenChars( '(', ')', posType, false ) &&
          !this->IsBetweenCharsFast( '(', ')', posType, false ) &&
          !this->IsBetweenChars( '<', '>', posType, false ) &&
          !this->IsBetweenCharsFast( '<', '>', posType, false ))
          {
          // This is a very simple check we count the number of comas
          unsigned int vars = 1;
          pos = static_cast<long int>(line.find(',',0));
          while(pos!=-1)
            {
            posType = m_BufferNoComment.find(',', posType+1);
            if( !this->IsBetweenChars( '(', ')', posType, false ) &&
              !this->IsBetweenCharsFast( '(', ')', posType, false ) &&
              !this->IsBetweenChars( '<', '>', posType, false ) &&
              !this->IsBetweenCharsFast( '<', '>', posType, false ))
              {
              // Check that we are not initializing an array
              bool betweenBraces = false;
              long int openCurly = pos-1;
              while(openCurly>0)
                {
                // Ok we have the opening
                if(line[openCurly] == '{')
                  {
                  long int posClosing = static_cast<long int>(this->FindClosingChar('{','}',openCurly,false,line));
                  if(posClosing == -1
                    || pos<posClosing)
                    {
                    betweenBraces = true;
                    }
                  break;
                  }
                openCurly--;
                }
              // Check if we are not at the end of the line
              bool endofline = true;
              long eof = pos+1;
              while(eof < (int)line.size())
                {
                if(line[eof] != ' ' && line[eof] != '\n'
                   && line[eof] != '\r' && line[eof] != '\t')
                  {
                  endofline = false;
                  break;
                  }
                eof++;
                }

              if(!betweenBraces && !endofline)
                {
                vars++;
                }
              }
            pos = static_cast<long int>(line.find(',',pos+1));
            }

          if(vars > max)
            {
            // len(str(2**64)) == 20 + 1 for +/- + 1  for '\0'
            char localval[22]={0}; //Make an extra large buffer to avoid compiler overflow warnings
            Error error;
            error.line = this->GetLineNumber(posType,true);
            error.line2 = error.line;
            error.number = VARIABLEPERLINE;
            error.description = "Number of variable per line exceed: ";
            snprintf(localval,sizeof(localval),"%d",vars);
            error.description += localval;
            error.description += " (max=";
            localval[0]='\0';
            snprintf(localval,sizeof(localval),"%ld",max);
            error.description += localval;
            error.description += ")";
            m_ErrorList.push_back(error);
            hasError = true;
            }
          }
        }// end firstWord
      posType = m_BufferNoComment.find(typeToFind,posType+1);
      }
  }

  return !hasError;
}